

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaYca.cpp
# Opt level: O1

void Imf_2_5::RgbaYca::reconstructChromaVert(int n,Rgba **ycaIn,Rgba *ycaOut)

{
  Rgba *pRVar1;
  short sVar2;
  long lVar3;
  float fVar4;
  
  if (0 < n) {
    lVar3 = 0;
    do {
      fVar4 = *(float *)((long)&half::_toFloat +
                        (ulong)*(ushort *)((long)&(ycaIn[0x1a]->r)._h + lVar3) * 4) * 0.002128 +
              *(float *)((long)&half::_toFloat +
                        (ulong)*(ushort *)((long)&(ycaIn[0x18]->r)._h + lVar3) * 4) * -0.00754 +
              *(float *)((long)&half::_toFloat +
                        (ulong)*(ushort *)((long)&(ycaIn[0x16]->r)._h + lVar3) * 4) * 0.019597 +
              *(float *)((long)&half::_toFloat +
                        (ulong)*(ushort *)((long)&(ycaIn[0x14]->r)._h + lVar3) * 4) * -0.043159 +
              *(float *)((long)&half::_toFloat +
                        (ulong)*(ushort *)((long)&(ycaIn[0x12]->r)._h + lVar3) * 4) * 0.087929 +
              *(float *)((long)&half::_toFloat +
                        (ulong)*(ushort *)((long)&(ycaIn[0x10]->r)._h + lVar3) * 4) * -0.186077 +
              *(float *)((long)&half::_toFloat +
                        (ulong)*(ushort *)((long)&(ycaIn[0xe]->r)._h + lVar3) * 4) * 0.627123 +
              *(float *)((long)&half::_toFloat +
                        (ulong)*(ushort *)((long)&(ycaIn[0xc]->r)._h + lVar3) * 4) * 0.627123 +
              *(float *)((long)&half::_toFloat +
                        (ulong)*(ushort *)((long)&(ycaIn[10]->r)._h + lVar3) * 4) * -0.186077 +
              *(float *)((long)&half::_toFloat +
                        (ulong)*(ushort *)((long)&(ycaIn[8]->r)._h + lVar3) * 4) * 0.087929 +
              *(float *)((long)&half::_toFloat +
                        (ulong)*(ushort *)((long)&(ycaIn[6]->r)._h + lVar3) * 4) * -0.043159 +
              *(float *)((long)&half::_toFloat +
                        (ulong)*(ushort *)((long)&(ycaIn[4]->r)._h + lVar3) * 4) * 0.019597 +
              *(float *)((long)&half::_toFloat +
                        (ulong)*(ushort *)((long)&((*ycaIn)->r)._h + lVar3) * 4) * 0.002128 +
              *(float *)((long)&half::_toFloat +
                        (ulong)*(ushort *)((long)&(ycaIn[2]->r)._h + lVar3) * 4) * -0.00754;
      if ((fVar4 != 0.0) || (NAN(fVar4))) {
        sVar2 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar4 >> 0x17) * 2);
        if (sVar2 == 0) {
          sVar2 = half::convert((int)fVar4);
        }
        else {
          sVar2 = sVar2 + (short)(((uint)fVar4 & 0x7fffff) + 0xfff +
                                  (uint)(((uint)fVar4 >> 0xd & 1) != 0) >> 0xd);
        }
      }
      else {
        sVar2 = (short)((uint)fVar4 >> 0x10);
      }
      *(short *)((long)&(ycaOut->r)._h + lVar3) = sVar2;
      fVar4 = *(float *)((long)&half::_toFloat +
                        (ulong)*(ushort *)((long)&(ycaIn[0x1a]->b)._h + lVar3) * 4) * 0.002128 +
              *(float *)((long)&half::_toFloat +
                        (ulong)*(ushort *)((long)&(ycaIn[0x18]->b)._h + lVar3) * 4) * -0.00754 +
              *(float *)((long)&half::_toFloat +
                        (ulong)*(ushort *)((long)&(ycaIn[0x16]->b)._h + lVar3) * 4) * 0.019597 +
              *(float *)((long)&half::_toFloat +
                        (ulong)*(ushort *)((long)&(ycaIn[0x14]->b)._h + lVar3) * 4) * -0.043159 +
              *(float *)((long)&half::_toFloat +
                        (ulong)*(ushort *)((long)&(ycaIn[0x12]->b)._h + lVar3) * 4) * 0.087929 +
              *(float *)((long)&half::_toFloat +
                        (ulong)*(ushort *)((long)&(ycaIn[0x10]->b)._h + lVar3) * 4) * -0.186077 +
              *(float *)((long)&half::_toFloat +
                        (ulong)*(ushort *)((long)&(ycaIn[0xe]->b)._h + lVar3) * 4) * 0.627123 +
              *(float *)((long)&half::_toFloat +
                        (ulong)*(ushort *)((long)&(ycaIn[0xc]->b)._h + lVar3) * 4) * 0.627123 +
              *(float *)((long)&half::_toFloat +
                        (ulong)*(ushort *)((long)&(ycaIn[10]->b)._h + lVar3) * 4) * -0.186077 +
              *(float *)((long)&half::_toFloat +
                        (ulong)*(ushort *)((long)&(ycaIn[8]->b)._h + lVar3) * 4) * 0.087929 +
              *(float *)((long)&half::_toFloat +
                        (ulong)*(ushort *)((long)&(ycaIn[6]->b)._h + lVar3) * 4) * -0.043159 +
              *(float *)((long)&half::_toFloat +
                        (ulong)*(ushort *)((long)&(ycaIn[4]->b)._h + lVar3) * 4) * 0.019597 +
              *(float *)((long)&half::_toFloat +
                        (ulong)*(ushort *)((long)&((*ycaIn)->b)._h + lVar3) * 4) * 0.002128 +
              *(float *)((long)&half::_toFloat +
                        (ulong)*(ushort *)((long)&(ycaIn[2]->b)._h + lVar3) * 4) * -0.00754;
      if ((fVar4 != 0.0) || (NAN(fVar4))) {
        sVar2 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar4 >> 0x17) * 2);
        if (sVar2 == 0) {
          sVar2 = half::convert((int)fVar4);
        }
        else {
          sVar2 = sVar2 + (short)(((uint)fVar4 & 0x7fffff) + 0xfff +
                                  (uint)(((uint)fVar4 >> 0xd & 1) != 0) >> 0xd);
        }
      }
      else {
        sVar2 = (short)((uint)fVar4 >> 0x10);
      }
      *(short *)((long)&(ycaOut->b)._h + lVar3) = sVar2;
      pRVar1 = ycaIn[0xd];
      *(undefined2 *)((long)&(ycaOut->g)._h + lVar3) =
           *(undefined2 *)((long)&(pRVar1->g)._h + lVar3);
      *(undefined2 *)((long)&(ycaOut->a)._h + lVar3) =
           *(undefined2 *)((long)&(pRVar1->a)._h + lVar3);
      lVar3 = lVar3 + 8;
    } while ((ulong)(uint)n << 3 != lVar3);
  }
  return;
}

Assistant:

void
reconstructChromaVert (int n,
		       const Rgba * const ycaIn[N],
		       Rgba ycaOut[/*n*/])
{
    for (int i = 0; i < n; ++i)
    {
	ycaOut[i].r = ycaIn[ 0][i].r *  0.002128f +
		      ycaIn[ 2][i].r * -0.007540f +
		      ycaIn[ 4][i].r *  0.019597f +
		      ycaIn[ 6][i].r * -0.043159f +
		      ycaIn[ 8][i].r *  0.087929f +
		      ycaIn[10][i].r * -0.186077f +
		      ycaIn[12][i].r *  0.627123f +
		      ycaIn[14][i].r *  0.627123f +
		      ycaIn[16][i].r * -0.186077f +
		      ycaIn[18][i].r *  0.087929f +
		      ycaIn[20][i].r * -0.043159f +
		      ycaIn[22][i].r *  0.019597f +
		      ycaIn[24][i].r * -0.007540f +
		      ycaIn[26][i].r *  0.002128f;

	ycaOut[i].b = ycaIn[ 0][i].b *  0.002128f +
		      ycaIn[ 2][i].b * -0.007540f +
		      ycaIn[ 4][i].b *  0.019597f +
		      ycaIn[ 6][i].b * -0.043159f +
		      ycaIn[ 8][i].b *  0.087929f +
		      ycaIn[10][i].b * -0.186077f +
		      ycaIn[12][i].b *  0.627123f +
		      ycaIn[14][i].b *  0.627123f +
		      ycaIn[16][i].b * -0.186077f +
		      ycaIn[18][i].b *  0.087929f +
		      ycaIn[20][i].b * -0.043159f +
		      ycaIn[22][i].b *  0.019597f +
		      ycaIn[24][i].b * -0.007540f +
		      ycaIn[26][i].b *  0.002128f;

	ycaOut[i].g = ycaIn[13][i].g;
	ycaOut[i].a = ycaIn[13][i].a;
    }
}